

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void hw_watchpoint_update_all_aarch64(ARMCPU_conflict1 *cpu)

{
  int n;
  
  cpu_watchpoint_remove_all_aarch64(&cpu->parent_obj,0x20);
  (cpu->env).cpu_watchpoint[0xe] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[0xf] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[0xc] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[0xd] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[10] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[0xb] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[8] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[9] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[6] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[7] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[4] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[5] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[2] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[3] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[0] = (CPUWatchpoint *)0x0;
  (cpu->env).cpu_watchpoint[1] = (CPUWatchpoint *)0x0;
  n = 0;
  do {
    hw_watchpoint_update_aarch64(cpu,n);
    n = n + 1;
  } while (n != 0x10);
  return;
}

Assistant:

void hw_watchpoint_update_all(ARMCPU *cpu)
{
    int i;
    CPUARMState *env = &cpu->env;

    /* Completely clear out existing QEMU watchpoints and our array, to
     * avoid possible stale entries following migration load.
     */
    cpu_watchpoint_remove_all(CPU(cpu), BP_CPU);
    memset(env->cpu_watchpoint, 0, sizeof(env->cpu_watchpoint));

    for (i = 0; i < ARRAY_SIZE(cpu->env.cpu_watchpoint); i++) {
        hw_watchpoint_update(cpu, i);
    }
}